

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

int expr_donew(expr *expr,int ac,t_atom *av)

{
  long *plVar1;
  ex_ex **ppeVar2;
  int iVar3;
  _binbuf *x;
  ex_ex *peVar4;
  ex_ex *eptr;
  anon_union_8_5_735de1bb_for_ex_cont *paVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int exp_strlen;
  char *exp_string;
  int local_44;
  long local_40;
  char *local_38;
  
  memset(expr->exp_var,0,0x960);
  x = binbuf_new();
  binbuf_add(x,ac,av);
  binbuf_gettext(x,&local_38,&local_44);
  binbuf_free(x);
  local_38 = (char *)resizebytes(local_38,(long)local_44,(long)local_44 + 1);
  local_38[local_44] = '\0';
  expr->exp_string = local_38;
  expr->exp_str = local_38;
  expr->exp_nexpr = 0;
  lVar9 = 0;
  do {
    peVar4 = (ex_ex *)malloc(0xf0);
    if (peVar4 == (ex_ex *)0x0) {
      post("ex_lex: no mem\n");
      lVar8 = lVar9;
LAB_00191244:
      eptr = (ex_ex *)0x0;
    }
    else {
      lVar6 = 10;
      lVar7 = 0;
      lVar8 = 0;
      eptr = peVar4;
      local_40 = lVar9;
      do {
        if (lVar6 <= lVar8) {
          eptr = (ex_ex *)realloc(eptr,(lVar6 * 8 + 0x50) * 3);
          if (eptr == (ex_ex *)0x0) {
            post("ex_lex: no mem\n");
            lVar8 = local_40;
            goto LAB_00191244;
          }
          lVar6 = lVar6 + 10;
          peVar4 = (ex_ex *)((long)&eptr->ex_cont + lVar7);
        }
        iVar3 = getoken(expr,peVar4);
        if (iVar3 != 0) {
          free(eptr);
          lVar8 = local_40;
          goto LAB_00191244;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x18;
        plVar1 = &peVar4->ex_type;
        peVar4 = peVar4 + 1;
      } while (*plVar1 != 0);
    }
    if (eptr == (ex_ex *)0x0) {
LAB_001913a0:
      if (0 < expr->exp_nexpr) {
        lVar9 = 0;
        do {
          free(expr->exp_stack[lVar9]);
          expr->exp_stack[lVar9] = (ex_ex *)0x0;
          lVar9 = lVar9 + 1;
        } while (lVar9 < expr->exp_nexpr);
      }
      expr->exp_nexpr = 0;
      iVar3 = 1;
      if (eptr != (ex_ex *)0x0) {
        free(eptr);
      }
      goto LAB_001913e7;
    }
    peVar4 = (ex_ex *)malloc(lVar8 * 0x18);
    iVar3 = expr->exp_nexpr;
    expr->exp_stack[iVar3] = peVar4;
    if (peVar4 == (ex_ex *)0x0) {
      pd_error(expr,"expr: malloc for expr nodes failed\n");
      goto LAB_001913a0;
    }
    peVar4[lVar8 + -1].ex_type = 0;
    expr->exp_nexpr = iVar3 + 1;
    peVar4 = ex_match(eptr,0);
    if (100 < (long)expr->exp_nexpr) {
      pd_error(expr,"expr: too many variables (maximum %d allowed)",100);
      goto LAB_001913a0;
    }
    if ((peVar4 == (ex_ex *)0x0) ||
       (paVar5 = &ex_parse(expr,eptr,expr->exp_stack[(long)expr->exp_nexpr + -1],(long *)0x0)->
                  ex_cont, paVar5 == (anon_union_8_5_735de1bb_for_ex_cont *)0x0)) goto LAB_001913a0;
    peVar4 = expr->exp_stack[(long)expr->exp_nexpr + -1];
    lVar9 = peVar4->ex_type;
    ppeVar2 = &peVar4->ex_end;
    if (*ppeVar2 != peVar4 && lVar9 != 0) {
      do {
        if (((lVar9 == 3) && ((peVar4->ex_cont).v_int == 0x3001c)) &&
           ((0x15 < (ulong)peVar4[1].ex_type ||
            ((0x202020UL >> (peVar4[1].ex_type & 0x3fU) & 1) == 0)))) {
          post("Bad left value: ");
          ex_print(peVar4);
          goto LAB_001913a0;
        }
        lVar9 = peVar4[1].ex_type;
      } while ((lVar9 != 0) && (peVar4 = peVar4 + 1, peVar4 != *ppeVar2));
    }
    free(eptr);
    lVar9 = lVar8;
  } while (*expr->exp_str != '\0');
  paVar5[2].v_vec = (t_float *)nullex.ex_end;
  lVar9 = nullex.ex_type;
  *paVar5 = nullex.ex_cont;
  paVar5[1].v_int = lVar9;
  iVar3 = 0;
LAB_001913e7:
  freebytes(local_38,(long)local_44 + 1);
  return iVar3;
}

Assistant:

int
expr_donew(struct expr *expr, int ac, t_atom *av)
{
        struct ex_ex *list;
        struct ex_ex *ret;
        long max_node = 0;              /* maximum number of nodes needed */
        char *exp_string;
        int exp_strlen;
        t_binbuf *b;
        int i;

        memset(expr->exp_var, 0, MAX_VARS * sizeof (*expr->exp_var));
#ifdef PD
        b = binbuf_new();
        binbuf_add(b, ac, av);
        binbuf_gettext(b, &exp_string, &exp_strlen);
        binbuf_free(b);
#else /* MSP */
 {
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[250];
    t_atom *ap;
    int indx;

    for (ap = av, indx = 0; indx < ac; indx++, ap = ++av) {
        int newlength;

        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ')
                        length--;
        atom_string(ap, string, 250);
        newlength = length + strlen(string) + 1;
        if (!(newbuf = t_resizebytes(buf, length, newlength)))
                                break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI)
                        buf[length-1] = '\n';
        else
                        buf[length-1] = ' ';
    }

    if (length && buf[length-1] == ' ') {
        if (newbuf = t_resizebytes(buf, length, length-1))
        {
            buf = newbuf;
            length--;
        }
    }
    exp_string = buf;
    exp_strlen  = length;
 }
#endif
        exp_string = (char *)t_resizebytes(exp_string, exp_strlen,exp_strlen+1);
        exp_string[exp_strlen] = 0;
        expr->exp_string = exp_string;
        expr->exp_str = exp_string;
        expr->exp_nexpr = 0;
        ret = (struct ex_ex *) 0;
        /*
         * if ret == 0 it means that we have no expression
         * so we let the pass go through to build a single null stack
         */
        while (*expr->exp_str || !ret) {
                list = ex_lex(expr, &max_node);
                if (!list) {            /* syntax error */
                        goto error;
                }
                expr->exp_stack[expr->exp_nexpr] =
                  (struct ex_ex *)fts_malloc(max_node * sizeof (struct ex_ex));
                                if (!expr->exp_stack[expr->exp_nexpr]) {
                                        post_error( (fts_object_t *) expr,
                                                "expr: malloc for expr nodes failed\n");
                                        goto error;
                                }
                                expr->exp_stack[expr->exp_nexpr][max_node-1].ex_type=0;
                expr->exp_nexpr++;
                ret = ex_match(list, (long)0);
                if (expr->exp_nexpr  > MAX_VARS)
                    /* we cannot exceed MAX_VARS '$' variables */
                {
                        post_error((fts_object_t *) expr,
                            "expr: too many variables (maximum %d allowed)",
                                MAX_VARS);
                        goto error;
                }
                if (!ret)               /* syntax error */
                        goto error;
                ret = ex_parse(expr,
                        list, expr->exp_stack[expr->exp_nexpr - 1], (long *)0);
                if (!ret || ex_checklval(expr->exp_stack[expr->exp_nexpr - 1]))
                        goto error;
                fts_free(list);
        }
        *ret = nullex;
        t_freebytes(exp_string, exp_strlen+1);
        return (0);
error:
        for (i = 0; i < expr->exp_nexpr; i++) {
                fts_free(expr->exp_stack[i]);
                expr->exp_stack[i] = 0;
        }
        expr->exp_nexpr = 0;
        if (list)
                fts_free(list);
        t_freebytes(exp_string, exp_strlen+1);
        return (1);
}